

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelwriter.h
# Opt level: O0

void Randomize(Mat *m,float a,float b)

{
  long lVar1;
  unsigned_short uVar2;
  long *in_RDI;
  float fVar3;
  size_t i_2;
  char *p_1;
  size_t i_1;
  unsigned_short *p;
  size_t i;
  ulong local_70;
  undefined8 in_stack_ffffffffffffffa0;
  ulong uVar4;
  ulong local_50;
  
  if (in_RDI[2] == 4) {
    for (local_50 = 0; local_50 < (ulong)(in_RDI[8] * (long)(int)in_RDI[7]); local_50 = local_50 + 1
        ) {
      fVar3 = RandomFloat((float)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                          (float)in_stack_ffffffffffffffa0);
      *(float *)(*in_RDI + local_50 * 4) = fVar3;
    }
  }
  else if (in_RDI[2] == 2) {
    lVar1 = *in_RDI;
    for (uVar4 = 0; uVar4 < (ulong)(in_RDI[8] * (long)(int)in_RDI[7]); uVar4 = uVar4 + 1) {
      fVar3 = RandomFloat((float)(uVar4 >> 0x20),(float)uVar4);
      uVar2 = ncnn::float32_to_float16(fVar3);
      *(unsigned_short *)(lVar1 + uVar4 * 2) = uVar2;
    }
  }
  else if (in_RDI[2] == 1) {
    lVar1 = *in_RDI;
    for (local_70 = 0; local_70 < (ulong)(in_RDI[8] * (long)(int)in_RDI[7]); local_70 = local_70 + 1
        ) {
      fVar3 = RandomFloat((float)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                          (float)in_stack_ffffffffffffffa0);
      *(char *)(lVar1 + local_70) = (char)(int)fVar3;
    }
  }
  return;
}

Assistant:

static void Randomize(ncnn::Mat& m, float a = -1.2f, float b = 1.2f)
{
    if (m.elemsize == 4)
    {
        for (size_t i = 0; i < m.total(); i++)
        {
            m[i] = RandomFloat(a, b);
        }
    }
    else if (m.elemsize == 2)
    {
        unsigned short* p = m;
        for (size_t i = 0; i < m.total(); i++)
        {
            p[i] = ncnn::float32_to_float16(RandomFloat(a, b));
        }
    }
    else if (m.elemsize == 1)
    {
        signed char* p = m;
        for (size_t i = 0; i < m.total(); i++)
        {
            p[i] = (signed char)RandomFloat(-127, 127);
        }
    }
}